

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O3

cmCMakePath * __thiscall
cmCMakePath::GetWideExtension(cmCMakePath *__return_storage_ptr__,cmCMakePath *this)

{
  size_type sVar1;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var2;
  uint uVar3;
  int iVar4;
  long lVar5;
  string_view source;
  string file;
  long *local_58;
  long local_50;
  long local_48 [2];
  path local_38;
  
  sVar1 = (this->Path)._M_pathname._M_string_length;
  if (sVar1 == 0) {
LAB_003b87b1:
    std::filesystem::__cxx11::path::path(&local_38);
  }
  else {
    _Var2._M_head_impl =
         (this->Path)._M_cmpts._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    uVar3 = (uint)_Var2._M_head_impl;
    if (((ulong)_Var2._M_head_impl & 3) == 0) {
      if ((this->Path)._M_pathname._M_dataplus._M_p[sVar1 - 1] != '/') {
        if (((ulong)_Var2._M_head_impl & 3) == 0) {
          lVar5 = std::filesystem::__cxx11::path::_List::end();
          if (((ulong)(this->Path)._M_cmpts._M_impl._M_t.
                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                      _M_head_impl & 3) == 0) {
            this = (cmCMakePath *)(lVar5 + -0x30);
          }
          uVar3 = (uint)(this->Path)._M_cmpts._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl;
        }
        if ((~uVar3 & 3) == 0) goto LAB_003b8772;
      }
      goto LAB_003b87b1;
    }
    if ((uVar3 & 3) != 3) goto LAB_003b87b1;
LAB_003b8772:
    std::filesystem::__cxx11::path::path(&local_38,&this->Path);
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,local_38._M_pathname._M_dataplus._M_p,
             local_38._M_pathname._M_dataplus._M_p + local_38._M_pathname._M_string_length);
  std::filesystem::__cxx11::path::~path(&local_38);
  if (local_50 != 0) {
    iVar4 = std::__cxx11::string::compare((char *)&local_58);
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)&local_58);
      if (iVar4 != 0) {
        lVar5 = std::__cxx11::string::find((char)&local_58,0x2e);
        if (lVar5 != -1) {
          source._M_str = (char *)((long)local_58 + lVar5);
          source._M_len = local_50 - lVar5;
          cmCMakePath(__return_storage_ptr__,source,generic_format);
          goto LAB_003b8867;
        }
      }
    }
  }
  (__return_storage_ptr__->Path)._M_pathname.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->Path)._M_pathname.field_2 + 8) = 0;
  (__return_storage_ptr__->Path)._M_pathname._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->Path)._M_pathname._M_string_length = 0;
  (__return_storage_ptr__->Path)._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (_Impl *)0x0;
  std::filesystem::__cxx11::path::path(&__return_storage_ptr__->Path);
LAB_003b8867:
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath cmCMakePath::GetWideExtension() const
{
  auto file = this->Path.filename().string();
  if (file.empty() || file == "." || file == "..") {
    return cmCMakePath{};
  }

  auto pos = file.find('.', file[0] == '.' ? 1 : 0);
  if (pos != std::string::npos) {
    return cm::string_view(file.data() + pos, file.length() - pos);
  }

  return cmCMakePath{};
}